

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::determine_tiles_task(dxt_hc *this,uint64 data,void *param_2)

{
  color_quad_u8 (*pacVar1) [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar2;
  float fVar3;
  uint uVar4;
  color_quad_u8 (*pacVar5) [16];
  ulong uVar6;
  double dVar7;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar9;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar10;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar11;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar12;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar13;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar14;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  color_quad_u8 *block;
  undefined1 *puVar20;
  byte bVar21;
  int t;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  color_quad_u8 *pcVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  byte *pbVar32;
  uint8 c;
  long lVar33;
  int iVar34;
  uint uVar35;
  byte *pbVar36;
  uint e;
  tile_details *this_00;
  uint *puVar37;
  uint *puVar38;
  vec<2U,_float> *this_01;
  uint a;
  ulong uVar39;
  float fVar40;
  float fVar41;
  uint local_a1c;
  int local_9f4;
  uint low16;
  color_quad_u8 *local_9c0;
  uint local_9b8;
  uint local_9b4;
  crn_dxt_quality local_9b0;
  bool local_9ac;
  ulong local_9a8;
  uint64 local_9a0;
  long local_998;
  anon_struct_16_4_e4b8e16b *local_990;
  ulong local_988;
  ulong local_980;
  float (*local_978) [8];
  uint *local_970;
  results results_1;
  params params;
  int scan [3];
  int refine [4];
  results results;
  uint high16;
  uint8 selectors [64];
  uint tile_error [3] [9];
  uint total_error [3] [8];
  etc1_optimizer optimizer;
  color_quad_u8 tilePixels [128];
  color_quad_u8 block_colors [4];
  
  uVar24 = this->m_pTask_pool->m_num_threads;
  etc1_optimizer::etc1_optimizer(&optimizer);
  etc1_optimizer::params::params(&params);
  local_9a8 = (ulong)(uVar24 + 1);
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  scan[0] = -1;
  scan[1] = 0;
  scan[2] = 1;
  refine[0] = -3;
  refine[1] = -2;
  refine[2] = 2;
  refine[3] = 3;
  local_990 = (this->m_params).m_levels;
  local_998 = data + 1;
  local_978 = this->m_color_derating;
  local_9a0 = data;
  for (uVar30 = 0; uVar30 < (this->m_params).m_num_levels; uVar30 = uVar30 + 1) {
    fVar3 = local_990[uVar30].m_weight;
    uVar4 = local_990[uVar30].m_block_width;
    uVar22 = (ulong)local_990[uVar30].m_num_blocks / (ulong)uVar4;
    uVar6 = uVar22 / (this->m_params).m_num_faces;
    uVar35 = (uint)((uVar22 * local_9a0) / local_9a8) & 0xfffffffe;
    uVar26 = (ulong)uVar35;
    local_988 = (ulong)((uint)((uVar22 * local_998) / local_9a8) & 0xfffffffe);
    uVar22 = uVar26 % uVar6;
    uVar35 = uVar35 * uVar4 + local_990[uVar30].m_first_block;
    while ((uint)uVar26 < (uint)local_988) {
      local_9f4 = 4;
      uVar23 = 2;
      iVar34 = (int)uVar22;
      local_a1c = uVar35;
      if (iVar34 != (int)uVar6) {
        local_9f4 = (uint)((uVar22 & 2) == 0) * 8 + -4;
        local_a1c = ((iVar34 << 0x1e) >> 0x1f & uVar4 * 2 - 4) + uVar35;
        uVar23 = iVar34 + 2;
      }
      uVar19 = uVar4 + uVar35;
      local_980 = uVar26;
      for (; uVar35 < uVar19; uVar35 = uVar35 + 2) {
        pacVar5 = this->m_blocks;
        for (uVar22 = 0; uVar22 < 0x40; uVar22 = uVar22 + 0x10) {
          uVar27 = uVar4;
          if ((uVar22 & 0x10) == 0) {
            uVar27 = 0;
          }
          uVar27 = ((uVar35 + 1) - (uint)(uVar22 < 0x20)) + uVar27;
          pacVar1 = pacVar5 + uVar27;
          aVar8 = (*pacVar1)[0].field_0;
          aVar9 = (*pacVar1)[1].field_0;
          aVar10 = (*pacVar1)[2].field_0;
          aVar11 = (*pacVar1)[3].field_0;
          uVar16 = *(undefined8 *)(pacVar5[uVar27] + 4);
          uVar17 = *(undefined8 *)(pacVar5[uVar27] + 4 + 2);
          paVar2 = &pacVar5[uVar27][8].field_0;
          aVar12 = *paVar2;
          aVar13 = paVar2[1];
          aVar14 = paVar2[2];
          aVar15 = paVar2[3];
          uVar18 = *(undefined8 *)(pacVar5[uVar27] + 0xc + 2);
          *(undefined8 *)(tilePixels + uVar22 + 0xc) = *(undefined8 *)(pacVar5[uVar27] + 0xc);
          *(undefined8 *)(tilePixels + uVar22 + 0xe) = uVar18;
          tilePixels[uVar22 + 8].field_0 = aVar12;
          tilePixels[uVar22 + 9].field_0 = aVar13;
          tilePixels[uVar22 + 10].field_0 = aVar14;
          tilePixels[uVar22 + 0xb].field_0 = aVar15;
          *(undefined8 *)(tilePixels + uVar22 + 4) = uVar16;
          *(undefined8 *)(tilePixels + uVar22 + 6) = uVar17;
          tilePixels[uVar22].field_0 = aVar8;
          tilePixels[uVar22 + 1].field_0 = aVar9;
          tilePixels[uVar22 + 2].field_0 = aVar10;
          tilePixels[uVar22 + 3].field_0 = aVar11;
        }
        for (uVar22 = 0; uVar22 < 0x40; uVar22 = uVar22 + 4) {
          uVar27 = uVar4;
          if (uVar22 < 0x20) {
            uVar27 = 0;
          }
          paVar2 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                   ((long)&pacVar5[uVar27 + uVar35 + (uint)(((uint)uVar22 >> 2 & 1) != 0)][0].
                           field_0 + (ulong)((uint)uVar22 & 0x18) * 2);
          aVar8 = paVar2[1];
          aVar9 = paVar2[2];
          aVar10 = paVar2[3];
          tilePixels[uVar22 + 0x40].field_0 = *paVar2;
          tilePixels[uVar22 + 0x41].field_0 = aVar8;
          tilePixels[uVar22 + 0x42].field_0 = aVar9;
          tilePixels[uVar22 + 0x43].field_0 = aVar10;
        }
        puVar37 = tile_error[1];
        for (uVar22 = 0; uVar22 != 9; uVar22 = uVar22 + 1) {
          uVar24 = 0x10 << ((byte)(uVar22 >> 2) & 0x1f);
          block = tilePixels + *(uint *)(&DAT_0018d260 + uVar22 * 4);
          if (this->m_has_etc_color_blocks == true) {
            params.m_num_src_pixels = uVar24;
            params.m_pSrc_pixels = block;
            etc1_optimizer::init(&optimizer,(EVP_PKEY_CTX *)&params);
            params.m_pScan_deltas = scan;
            params.m_scan_delta_size = 3;
            etc1_optimizer::compute(&optimizer);
            if (params.m_num_src_pixels * 0x177 < results.m_error) {
              params.m_pScan_deltas = refine;
              params.m_scan_delta_size = 4;
              etc1_optimizer::compute(&optimizer);
            }
            tile_error[0][uVar22] = (uint)results.m_error;
          }
          else if (this->m_has_color_blocks == true) {
            dxt_fast::compress_color_block(uVar24,block,&low16,&high16,selectors,false);
            dxt1_block::get_block_colors4(block_colors,(uint16)low16,(uint16)high16);
            uVar28 = 0;
            pcVar25 = block;
            for (uVar26 = 0; uVar26 != uVar24; uVar26 = uVar26 + 1) {
              for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
                iVar34 = (uint)(pcVar25->field_0).c[lVar33] -
                         (uint)block_colors[selectors[uVar26]].field_0.c[lVar33];
                uVar28 = uVar28 + iVar34 * iVar34;
              }
              pcVar25 = pcVar25 + 1;
            }
            tile_error[0][uVar22] = uVar28;
          }
          local_970 = puVar37;
          for (uVar26 = 0; uVar26 < this->m_num_alpha_blocks; uVar26 = uVar26 + 1) {
            uVar28 = (this->m_params).m_alpha_component_indices[uVar26];
            dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
                      ((dxt5_endpoint_optimizer *)block_colors);
            low16 = 0;
            local_9b4 = (uint)(byte)uVar28;
            local_9ac = false;
            local_9b0 = cCRNDXTQualityNormal;
            results_1.m_pSelectors = selectors;
            local_9c0 = block;
            local_9b8 = uVar24;
            dxt5_endpoint_optimizer::compute
                      ((dxt5_endpoint_optimizer *)block_colors,(params *)&low16,&results_1);
            dxt5_block::get_block_values8
                      (&high16,(uint)results_1.m_first_endpoint,(uint)results_1.m_second_endpoint);
            *puVar37 = (uint)results_1.m_error;
            dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
                      ((dxt5_endpoint_optimizer *)block_colors);
            puVar37 = puVar37 + 9;
          }
          puVar37 = local_970 + 1;
        }
        uVar27 = this->m_num_alpha_blocks;
        for (bVar21 = this->m_has_color_blocks ^ 1; (uint)bVar21 < uVar27 + 1; bVar21 = bVar21 + 1)
        {
          pbVar32 = &DAT_0018d220;
          uVar22 = 0;
          while (uVar22 != 8) {
            puVar37 = total_error[bVar21] + uVar22;
            uVar22 = uVar22 + 1;
            uVar24 = 0;
            pbVar36 = pbVar32;
            for (uVar26 = uVar22 & 0xffffffff; (byte)uVar26 != 0;
                uVar26 = (ulong)(byte)((byte)uVar26 >> 1)) {
              uVar24 = uVar24 + tile_error[bVar21][*pbVar36];
              pbVar36 = pbVar36 + 1;
            }
            *puVar37 = uVar24;
            pbVar32 = pbVar32 + 4;
          }
        }
        fVar41 = 0.0;
        puVar37 = total_error[1];
        uVar22 = 0;
        for (uVar26 = 0; uVar26 != 8; uVar26 = uVar26 + 1) {
          fVar40 = 0.0;
          if (this->m_has_color_blocks == true) {
            fVar40 = optimizer.m_avg_color.m_s[uVar26 - 0x1d];
            dVar7 = 999999.0;
            if (fVar40 != 0.0) {
              dVar7 = log10(255.0 / SQRT((double)(uint)fVar40 / 192.0));
              dVar7 = dVar7 * 20.0;
              uVar27 = this->m_num_alpha_blocks;
            }
            fVar40 = 1.0;
            if (uVar27 != 0) {
              fVar40 = (this->m_params).m_adaptive_tile_color_alpha_weighting_ratio;
            }
            dVar7 = dVar7 - (double)local_978[uVar30][uVar26];
            if (dVar7 <= 0.0) {
              dVar7 = 0.0;
            }
            fVar40 = (float)dVar7 * fVar40;
          }
          puVar38 = puVar37;
          for (uVar39 = 0; uVar39 < uVar27; uVar39 = uVar39 + 1) {
            dVar7 = 999999.0;
            if (*puVar38 != 0) {
              dVar7 = (double)*puVar38 * 0.015625;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              dVar7 = log10(255.0 / dVar7);
              dVar7 = dVar7 * 20.0;
              uVar27 = this->m_num_alpha_blocks;
            }
            dVar7 = dVar7 - (double)this->m_alpha_derating[uVar26];
            if (dVar7 <= 0.0) {
              dVar7 = 0.0;
            }
            fVar40 = fVar40 + (float)dVar7;
            puVar38 = puVar38 + 8;
          }
          if (fVar41 < fVar40) {
            uVar22 = uVar26 & 0xffffffff;
            fVar41 = fVar40;
          }
          puVar37 = puVar37 + 1;
        }
        lVar33 = 0;
        for (uVar27 = (int)uVar22 + 1; uVar27 != 0; uVar27 = uVar27 >> 1) {
          this_00 = (this->m_tiles).m_p + (local_a1c | (uint)lVar33);
          vector<crnlib::color_quad<unsigned_char,_int>_>::append
                    (&this_00->pixels,
                     tilePixels +
                     *(uint *)(&DAT_0018d260 + (ulong)(byte)(&DAT_0018d220)[lVar33 + uVar22 * 4] * 4
                              ),0x10 << ((byte)(&DAT_0018d220)[lVar33 + uVar22 * 4] >> 2 & 0x1f));
          this_00->weight = fVar3;
          if (this->m_has_color_blocks == true) {
            palettize_color((vec6F *)block_colors,this,(this_00->pixels).m_p,
                            (this_00->pixels).m_size);
            vec<6U,_float>::operator=(&this_00->color_endpoint,(vec<6U,_float> *)block_colors);
          }
          this_01 = this_00->alpha_endpoints;
          for (uVar26 = 0; uVar26 < this->m_num_alpha_blocks; uVar26 = uVar26 + 1) {
            palettize_alpha((dxt_hc *)block_colors,(color_quad_u8 *)this,(uint)(this_00->pixels).m_p
                            ,(this_00->pixels).m_size);
            vec<2U,_float>::operator=(this_01,(vec<2U,_float> *)block_colors);
            this_01 = this_01 + 1;
          }
          lVar33 = lVar33 + 1;
        }
        puVar20 = g_tile_map + uVar22 * 4;
        for (lVar33 = 0; lVar33 != 2; lVar33 = lVar33 + 1) {
          uVar27 = uVar4;
          if (lVar33 == 0) {
            uVar27 = 0;
          }
          for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
            uVar31 = uVar27 + uVar35 + (int)lVar29;
            (this->m_block_encodings).m_p[uVar31] = (uchar)uVar22;
            (this->m_tile_indices).m_p[uVar31] = (byte)puVar20[lVar29] | local_a1c;
          }
          puVar20 = puVar20 + 2;
        }
        local_a1c = local_a1c + local_9f4;
      }
      uVar35 = uVar35 + uVar4;
      uVar22 = (ulong)uVar23;
      uVar26 = (ulong)((int)local_980 + 2);
    }
  }
  etc1_optimizer::~etc1_optimizer(&optimizer);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[9] = { 0, 16, 32, 48, 0, 32, 64, 96, 64 };
        uint8 tiles[8][4] = { { 8 }, { 6, 7 }, { 4, 5 }, { 6, 1, 3 }, { 7, 0, 2 }, { 4, 2, 3 }, { 5, 0, 1 }, { 0, 2, 1, 3 } };
        color_quad_u8 tilePixels[128];
        uint8 selectors[64];
        uint tile_error[3][9];
        uint total_error[3][8];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint width = m_params.m_levels[level].m_block_width;
            uint height = m_params.m_levels[level].m_num_blocks / width;
            uint faceHeight = height / m_params.m_num_faces;
            uint h = height * data / num_tasks & ~1;
            uint hEnd = height * (data + 1) / num_tasks & ~1;
            uint hFace = h % faceHeight;
            uint b = m_params.m_levels[level].m_first_block + h * width;

            for (; h < hEnd; h += 2, hFace += 2, b += width)
            {
                uint tile_offset = b;
                uint tile_offset_delta = 4;
                if (hFace == faceHeight)
                {
                    hFace = 0;
                }
                else if (hFace & 2)
                {
                    tile_offset_delta = -4;
                    tile_offset += (width << 1) + tile_offset_delta;
                }
                for (uint bNext = b + width; b < bNext; b += 2, tile_offset += tile_offset_delta)
                {
                    for (int t = 0; t < 64; t += 16)
                    {
                        memcpy(tilePixels + t, m_blocks[b + (t & 16 ? width : 0) + (t & 32 ? 1 : 0)], 64);
                    }
                    for (int t = 0; t < 64; t += 4)
                    {
                        memcpy(tilePixels + 64 + t, m_blocks[b + (t & 32 ? width : 0) + (t & 4 ? 1 : 0)] + (t >> 1 & 12), 16);
                    }

                    for (uint t = 0; t < 9; t++)
                    {
                        color_quad_u8* pixels = tilePixels + offsets[t];
                        uint size = 16 << (t >> 2);
                        if (m_has_etc_color_blocks)
                        {
                            params.m_pSrc_pixels = pixels;
                            params.m_num_src_pixels = results.m_n = size;
                            optimizer.init(params, results);
                            params.m_pScan_deltas = scan;
                            params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                            optimizer.compute();
                            if (results.m_error > 375 * params.m_num_src_pixels)
                            {
                                params.m_pScan_deltas = refine;
                                params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                                optimizer.compute();
                            }
                            tile_error[cColor][t] = results.m_error;
                        }
                        else if (m_has_color_blocks)
                        {
                            uint low16, high16;
                            dxt_fast::compress_color_block(size, pixels, low16, high16, selectors);
                            color_quad_u8 block_colors[4];
                            dxt1_block::get_block_colors4(block_colors, low16, high16);
                            uint error = 0;
                            for (uint p = 0; p < size; p++)
                            {
                                for (uint8 c = 0; c < 3; c++)
                                {
                                    uint delta = pixels[p][c] - block_colors[selectors[p]][c];
                                    error += delta * delta;
                                }
                            }
                            tile_error[cColor][t] = error;
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            uint8 component = m_params.m_alpha_component_indices[a];
                            dxt5_endpoint_optimizer optimizer;
                            dxt5_endpoint_optimizer::params params;
                            dxt5_endpoint_optimizer::results results;
                            params.m_pPixels = pixels;
                            params.m_num_pixels = size;
                            params.m_comp_index = component;
                            params.m_use_both_block_types = false;
                            params.m_quality = cCRNDXTQualityNormal;
                            results.m_pSelectors = selectors;
                            optimizer.compute(params, results);
                            uint block_values[cDXT5SelectorValues];
                            dxt5_block::get_block_values8(block_values, results.m_first_endpoint, results.m_second_endpoint);
                            tile_error[cAlpha0 + a][t] = results.m_error;
                        }
                    }

                    for (uint8 c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        for (uint8 e = 0; e < 8; e++)
                        {
                            total_error[c][e] = 0;
                            for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                            {
                                total_error[c][e] += tile_error[c][tiles[e][t]];
                            }
                        }
                    }

                    float best_quality = 0.0f;
                    uint best_encoding = 0;
                    for (uint e = 0; e < 8; e++)
                    {
                        float quality = 0;
                        if (m_has_color_blocks)
                        {
                            double peakSNR = total_error[cColor][e] ? log10(255.0f / sqrt(total_error[cColor][e] / 192.0)) * 20.0f : 999999.0f;
                            quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                            if (m_num_alpha_blocks)
                            {
                                quality *= m_params.m_adaptive_tile_color_alpha_weighting_ratio;
                            }
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            double peakSNR = total_error[cAlpha0 + a][e] ? log10(255.0f / sqrt(total_error[cAlpha0 + a][e] / 64.0)) * 20.0f : 999999.0f;
                            quality += (float)math::maximum<double>(peakSNR - m_alpha_derating[e], 0.0f);
                        }
                        if (quality > best_quality)
                        {
                            best_quality = quality;
                            best_encoding = e;
                        }
                    }

                    for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                    {
                        tile_details& tile = m_tiles[tile_offset | tile_index];
                        uint t = tiles[best_encoding][tile_index];
                        tile.pixels.append(tilePixels + offsets[t], 16 << (t >> 2));
                        tile.weight = weight;
                        if (m_has_color_blocks)
                        {
                            tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            tile.alpha_endpoints[a] = palettize_alpha(tile.pixels.get_ptr(), tile.pixels.size(), m_params.m_alpha_component_indices[a]);
                        }
                    }

                    for (uint by = 0; by < 2; by++)
                    {
                        for (uint bx = 0; bx < 2; bx++)
                        {
                            m_block_encodings[b + (by ? width : 0) + bx] = best_encoding;
                            m_tile_indices[b + (by ? width : 0) + bx] = tile_offset | g_tile_map[best_encoding][by][bx];
                        }
                    }
                }
            }
        }
    }